

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcTestEvaluateInstructionTree(char *resultBuf,uint resultBufSize)

{
  bool bVar1;
  int iVar2;
  nullres nVar3;
  TraceScope traceScope;
  TraceScope local_20;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcTestEvaluateInstructionTree::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&nullcTestEvaluateInstructionTree::token), iVar2 != 0)) {
    nullcTestEvaluateInstructionTree::token =
         NULLC::TraceGetToken("nullc","nullcTestEvaluateInstructionTree");
    __cxa_guard_release(&nullcTestEvaluateInstructionTree::token);
  }
  NULLC::TraceScope::TraceScope(&local_20,nullcTestEvaluateInstructionTree::token);
  if (NULLC::compilerCtx == 0) {
    NULLC::nullcLastError = "ERROR: there is no active compiler context";
  }
  else {
    bVar1 = TestEvaluation((ExpressionContext *)(NULLC::compilerCtx + 0x18b8),
                           *(VmModule **)(NULLC::compilerCtx + 0xa320),resultBuf,resultBufSize,
                           *(char **)(NULLC::compilerCtx + 0x20),
                           *(uint *)(NULLC::compilerCtx + 0x28));
    nVar3 = '\x01';
    if (bVar1) goto LAB_001f4b71;
    NULLC::nullcLastError = *(char **)(NULLC::compilerCtx + 0x20);
  }
  nVar3 = '\0';
LAB_001f4b71:
  NULLC::TraceScope::~TraceScope(&local_20);
  return nVar3;
}

Assistant:

nullres nullcTestEvaluateInstructionTree(char *resultBuf, unsigned resultBufSize)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcTestEvaluateInstructionTree");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	if(!TestEvaluation(compilerCtx->exprCtx, compilerCtx->vmModule, resultBuf, resultBufSize, compilerCtx->errorBuf, compilerCtx->errorBufSize))
	{
		nullcLastError = compilerCtx->errorBuf;
		return false;
	}

	return true;
}